

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

int telemetry_messenger_unsubscribe_for_messages(TELEMETRY_MESSENGER_HANDLE messenger_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x5aa;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x5aa;
    }
    pcVar4 = "telemetry_messenger_unsubscribe_for_messages failed (messenger_handle is NULL)";
    iVar2 = 0x5ab;
  }
  else {
    if (messenger_handle->receive_messages != false) {
      messenger_handle->receive_messages = false;
      messenger_handle->on_message_received_callback = (ON_TELEMETRY_MESSENGER_MESSAGE_RECEIVED)0x0;
      messenger_handle->on_message_received_context = (void *)0x0;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x5b3;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x5b3;
    }
    pcVar4 = "telemetry_messenger_unsubscribe_for_messages failed (messenger is not subscribed)";
    iVar2 = 0x5b4;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
            ,"telemetry_messenger_unsubscribe_for_messages",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int telemetry_messenger_unsubscribe_for_messages(TELEMETRY_MESSENGER_HANDLE messenger_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("telemetry_messenger_unsubscribe_for_messages failed (messenger_handle is NULL)");
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->receive_messages == false)
        {
            result = MU_FAILURE;
            LogError("telemetry_messenger_unsubscribe_for_messages failed (messenger is not subscribed)");
        }
        else
        {
            instance->receive_messages = false;

            instance->on_message_received_callback = NULL;

            instance->on_message_received_context = NULL;

            result = RESULT_OK;
        }
    }

    return result;
}